

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgSequenceOptimizer.cpp
# Opt level: O1

OptimizerResult
TasGrid::Optimizer::performSecantSearch<(TasGrid::TypeOneDRule)15>
          (CurrentNodes<(TasGrid::TypeOneDRule)15> *current,double left,double right)

{
  uint uVar1;
  bool bVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double x;
  OptimizerResult OVar7;
  
  dVar3 = getDerivative<(TasGrid::TypeOneDRule)15>(current,left);
  dVar4 = getDerivative<(TasGrid::TypeOneDRule)15>(current,right);
  dVar5 = dVar3;
  x = right;
  if (ABS(dVar3) < ABS(dVar4)) {
    dVar5 = dVar4;
    dVar4 = dVar3;
    x = left;
    left = right;
  }
  if (3e-12 < ABS(dVar4)) {
    dVar3 = dVar4;
    dVar6 = x;
    uVar1 = 0;
    do {
      x = dVar6 - ((dVar6 - left) * dVar3) / (dVar3 - dVar5);
      dVar4 = getDerivative<(TasGrid::TypeOneDRule)15>(current,x);
      if (ABS(dVar4) <= 3e-12) break;
      bVar2 = uVar1 < 999;
      dVar5 = dVar3;
      dVar3 = dVar4;
      left = dVar6;
      dVar6 = x;
      uVar1 = uVar1 + 1;
    } while (bVar2);
  }
  OVar7.value = dVar4;
  OVar7.node = x;
  return OVar7;
}

Assistant:

OptimizerResult performSecantSearch(CurrentNodes<rule> const& current, double left, double right){
    auto func = [&](double x)->OptimizerResult{ return {x, getDerivative<rule>(current, x)}; };

    OptimizerResult past    = func(left);
    OptimizerResult present = func(right);

    if (std::abs(past.value) < std::abs(present.value))
        std::swap(past, present);

    int iterations = 0;
    while((std::abs(present.value) > 3.0 * Maths::num_tol) && (iterations < 1000)){ // 1000 guards against stagnation
        OptimizerResult future = func(present.node - present.value * (present.node - past.node) / (present.value - past.value));
        past    = present;
        present = future;
        iterations++;
    }

    return present;
}